

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
               *this,Context *context)

{
  Context **this_00;
  Context **this_01;
  deInt32 *pdVar1;
  undefined8 uVar2;
  int iVar3;
  Context *pCVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  TestInstance *pTVar7;
  TextureFormat this_02;
  long lVar8;
  long lVar9;
  _func_int **pp_Var10;
  Context *pCVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  Context *pCVar16;
  deUint32 step;
  ulong uVar17;
  bool bVar18;
  _func_int **pp_Var19;
  int iVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec4 gMax;
  Vec4 gMin;
  Vector<float,_4> res_3;
  TextureFormatInfo fmtInfo;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  RGBA local_150;
  RGBA local_14c;
  TextureFormat local_148;
  float fStack_140;
  float fStack_13c;
  Vec4 local_138;
  undefined1 local_128 [4];
  float fStack_124;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  uint local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined4 local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vec4 local_88;
  TextureFormatInfo local_78;
  
  pTVar7 = (TestInstance *)operator_new(0x288);
  pTVar7->m_context = context;
  pTVar7->_vptr_TestInstance = (_func_int **)&PTR__Texture2DArrayShadowTestInstance_00d39660;
  pTVar7[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar7[1].m_context;
  this_01 = &pTVar7[4].m_context;
  pTVar7[1].m_context = (Context *)0x0;
  pTVar7[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar7[2].m_context = (Context *)0x0;
  pTVar7[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar7[3].m_context = (Context *)0x0;
  pTVar7[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)this_01,context,
             (this->m_testsParameters).super_Texture2DArrayTestCaseParameters.
             super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.sampleCount,
             0x40,0x40);
  *(undefined4 *)&pTVar7[0x28]._vptr_TestInstance = 0;
  pp_Var19 = pTVar7[1]._vptr_TestInstance;
  uVar15 = *(uint *)((long)pp_Var19 + 0x44);
  if ((int)*(uint *)((long)pp_Var19 + 0x44) < (int)*(uint *)(pp_Var19 + 8)) {
    uVar15 = *(uint *)(pp_Var19 + 8);
  }
  uVar13 = 0x20;
  if (uVar15 != 0) {
    uVar13 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 ^ 0x1f;
  }
  _local_128 = ::vk::mapVkFormat(*(VkFormat *)(pp_Var19 + 4));
  tcu::getTextureFormatInfo(&local_78,(TextureFormat *)local_128);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
             *)this_00,2);
  local_148.order = 0x1f - uVar13;
  local_148.type = SNORM_INT8;
  local_1a8._0_4_ = local_78.valueMax.m_data[0];
  local_1a8._4_4_ = local_78.valueMax.m_data[1];
  fStack_1a0 = local_78.valueMax.m_data[2];
  fStack_19c = local_78.valueMax.m_data[3];
  local_178 = local_78.valueMin.m_data[0];
  fStack_174 = local_78.valueMin.m_data[1];
  fStack_170 = local_78.valueMin.m_data[2];
  fStack_16c = local_78.valueMin.m_data[3];
  local_1a8._0_4_ = (float)local_1a8 - local_178;
  local_1a8._4_4_ = local_1a8._4_4_ - fStack_174;
  fStack_1a0 = fStack_1a0 - fStack_170;
  fStack_19c = fStack_19c - fStack_16c;
  bVar21 = true;
  do {
    bVar18 = bVar21;
    this_02 = (TextureFormat)operator_new(0x78);
    local_138.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar7[1]._vptr_TestInstance + 4));
    pp_Var19 = pTVar7[1]._vptr_TestInstance;
    pipeline::TestTexture2DArray::TestTexture2DArray
              ((TestTexture2DArray *)this_02,(TextureFormat *)&local_138,*(int *)(pp_Var19 + 8),
               *(int *)((long)pp_Var19 + 0x44),*(int *)(pp_Var19 + 9));
    uStack_120 = (SharedPtrStateBase *)0x0;
    _local_128 = this_02;
    uStack_120 = (SharedPtrStateBase *)operator_new(0x20);
    uStack_120->strongRefCount = 0;
    uStack_120->weakRefCount = 0;
    uStack_120->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d386e0;
    uStack_120[1]._vptr_SharedPtrStateBase = (_func_int **)this_02;
    uStack_120->strongRefCount = 1;
    uStack_120->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2DArray> *)local_128);
    if (uStack_120 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &uStack_120->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_128 = (undefined1  [4])0x0;
        fStack_124 = 0.0;
        (*uStack_120->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &uStack_120->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (uStack_120 != (SharedPtrStateBase *)0x0)) {
        (*uStack_120->_vptr_SharedPtrStateBase[1])();
      }
    }
    bVar21 = false;
  } while (bVar18);
  if (uVar15 != 0) {
    uVar14 = 0;
    uVar12 = (ulong)local_148 & 0xffffffff;
    if ((int)local_148.order < 1) {
      uVar12 = uVar14;
    }
    fStack_140 = fStack_1a0 * 1.0 + fStack_170;
    fStack_13c = fStack_19c * 0.0 + fStack_16c;
    local_148.type = (ChannelType)(local_1a8._4_4_ * 1.0 + fStack_174);
    local_148.order = (ChannelOrder)((float)local_1a8 * 1.0 + local_178);
    do {
      fStack_124 = local_1a8._4_4_ * -0.5 + fStack_174;
      local_128 = (undefined1  [4])((float)local_1a8 * -0.5 + local_178);
      uStack_120 = (SharedPtrStateBase *)
                   CONCAT44(fStack_19c * 2.0 + fStack_16c,fStack_1a0 * -0.5 + fStack_170);
      local_138.m_data._0_8_ = local_148;
      local_138.m_data[2] = fStack_140;
      local_138.m_data[3] = fStack_13c;
      lVar8 = (*(code *)(*this_00)->m_testCtx->m_platform[0x11]._vptr_Platform)();
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)(*(long *)(lVar8 + 0x20) + uVar14),(Vec4 *)local_128,
                 &local_138);
      uVar14 = uVar14 + 0x28;
    } while (uVar12 * 0x28 + 0x28 != uVar14);
    lVar8 = 0;
    iVar20 = 0;
    do {
      lVar9 = (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x88)
              )();
      uVar15 = (0xffffff / (0x20 - uVar13)) * iVar20;
      local_14c.m_value = uVar15 | 0xff000000;
      lVar9 = *(long *)(lVar9 + 0x20);
      tcu::RGBA::toVec(&local_14c);
      local_150.m_value = ~uVar15 | 0xff000000;
      fStack_124 = local_138.m_data[1] * local_1a8._4_4_ + fStack_174;
      local_128 = (undefined1  [4])(local_138.m_data[0] * (float)local_1a8 + local_178);
      uStack_120 = (SharedPtrStateBase *)
                   CONCAT44(local_138.m_data[3] * fStack_19c + fStack_16c,
                            local_138.m_data[2] * fStack_1a0 + fStack_170);
      tcu::RGBA::toVec(&local_150);
      local_88.m_data[0] = local_98 * (float)local_1a8 + local_178;
      local_88.m_data[1] = fStack_94 * local_1a8._4_4_ + fStack_174;
      local_88.m_data[2] = fStack_90 * fStack_1a0 + fStack_170;
      local_88.m_data[3] = fStack_8c * fStack_19c + fStack_16c;
      tcu::fillWithGrid((PixelBufferAccess *)(lVar9 + lVar8),4,(Vec4 *)local_128,&local_88);
      iVar20 = iVar20 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar12 * 0x28 + 0x28 != lVar8);
  }
  for (pCVar16 = pTVar7[1].m_context; pCVar16 != (Context *)pTVar7[2]._vptr_TestInstance;
      pCVar16 = (Context *)&pCVar16->m_progCollection) {
    TextureRenderer::add2DArrayTexture((TextureRenderer *)this_01,(TestTexture2DArraySp *)pCVar16);
  }
  local_10c = 0;
  bVar21 = *(int *)pTVar7[1]._vptr_TestInstance - 5U < 2;
  if (!bVar21) {
    local_10c = 0x3f000000;
  }
  lVar8 = 0;
  _local_128 = (TextureFormat)((ulong)*(uint *)(&DAT_00b58740 + (ulong)bVar21 * 4) << 0x20);
  uStack_120 = (SharedPtrStateBase *)0x4039999a3fcccccd;
  uStack_118 = 0xc02ccccdbf800000;
  local_110 = 0;
  local_108 = 0xbfaccccdc0000000;
  uStack_100 = 0x3f333333be4ccccd;
  local_f8 = 1;
  local_f4 = *(uint *)(&DAT_00b58740 + (ulong)bVar21 * 4);
  local_f0 = 0x3e8ccccd3e0f5c29;
  uStack_e8 = 0xbf8ccccdbfc00000;
  local_e0 = 1;
  local_dc = local_10c;
  local_d8 = 0xc028f5c3bf6b851f;
  uStack_d0 = 0xbdcccccd3ecccccd;
  local_c8 = 1;
  local_c4 = 0xbefae1483f8ccccd;
  uStack_bc = 0x3ee66666be6147ae;
  local_b4 = 0x13f7851ec;
  local_ac = 0xbf59999abdcccccd;
  uStack_a4 = 0x3e8000003f400000;
  local_9c = 0x3f1c28f6;
  fVar22 = (float)*(int *)(pTVar7[1]._vptr_TestInstance + 9);
  do {
    iVar20 = *(int *)(local_128 + lVar8 * 0x18);
    local_148.order = *(ChannelOrder *)(local_128 + lVar8 * 0x18 + 4);
    fVar24 = *(float *)((long)&uStack_120 + lVar8 * 0x18 + 4);
    uVar2 = (&uStack_118)[lVar8 * 3];
    fVar23 = expf(*(float *)(&uStack_120 + lVar8 * 3) * 0.6931472);
    dVar5 = TextureRenderer::getRenderWidth((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar20) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    iVar3 = *(int *)(lVar9 + 0x38);
    fVar24 = expf(fVar24 * 0.6931472);
    dVar6 = TextureRenderer::getRenderHeight((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar20) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    local_178 = (float)uVar2;
    fStack_174 = (float)((ulong)uVar2 >> 0x20);
    fVar23 = (fVar23 * (float)dVar5) / (float)iVar3 + local_178;
    fVar24 = (fVar24 * (float)dVar6) / (float)*(int *)(lVar9 + 0x3c) + fStack_174;
    pCVar16 = pTVar7[3].m_context;
    if (pCVar16 == (Context *)pTVar7[4]._vptr_TestInstance) {
      local_1a8 = CONCAT44(fVar24,fVar23);
      pCVar4 = (Context *)pTVar7[3]._vptr_TestInstance;
      lVar9 = (long)pCVar16 - (long)pCVar4;
      if (lVar9 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar14 = lVar9 >> 5;
      uVar12 = uVar14;
      if (pCVar16 == pCVar4) {
        uVar12 = 1;
      }
      uVar17 = uVar12 + uVar14;
      if (0x3fffffffffffffe < uVar17) {
        uVar17 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar12,uVar14)) {
        uVar17 = 0x3ffffffffffffff;
      }
      pp_Var10 = (_func_int **)operator_new(uVar17 * 0x20);
      *(uint *)((long)pp_Var10 + lVar9) = (uint)(0 < iVar20);
      *(undefined8 *)((long)pp_Var10 + lVar9 + 4) = uVar2;
      *(undefined4 *)((long)pp_Var10 + lVar9 + 0xc) = 0xbf000000;
      *(undefined8 *)((long)pp_Var10 + lVar9 + 0x10) = local_1a8;
      *(float *)((long)pp_Var10 + lVar9 + 0x18) = fVar22;
      *(ChannelOrder *)((long)pp_Var10 + lVar9 + 0x1c) = local_148.order;
      pp_Var19 = pp_Var10;
      for (pCVar11 = pCVar4; pCVar16 != pCVar11;
          pCVar11 = (Context *)
                    &(pCVar11->m_device).
                     super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                     m_data.field_0x8) {
        *(undefined4 *)pp_Var19 = *(undefined4 *)&pCVar11->m_testCtx;
        lVar9 = 1;
        do {
          *(undefined4 *)((long)pp_Var19 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar11->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        lVar9 = 4;
        do {
          *(undefined4 *)((long)pp_Var19 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar11->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
        *(undefined4 *)((long)pp_Var19 + 0x1c) =
             *(undefined4 *)
              ((long)&(pCVar11->m_device).
                      super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                      m_data.ptr + 4);
        pp_Var19 = pp_Var19 + 4;
      }
      if (pCVar4 != (Context *)0x0) {
        operator_delete(pCVar4,(long)pTVar7[4]._vptr_TestInstance - (long)pCVar4);
      }
      pTVar7[3]._vptr_TestInstance = pp_Var10;
      pTVar7[3].m_context = (Context *)(pp_Var19 + 4);
      pTVar7[4]._vptr_TestInstance = pp_Var10 + uVar17 * 4;
    }
    else {
      *(uint *)&pCVar16->m_testCtx = (uint)(0 < iVar20);
      *(float *)((long)&pCVar16->m_testCtx + 4) = local_178;
      *(float *)&pCVar16->m_platformInterface = fStack_174;
      *(undefined4 *)((long)&pCVar16->m_platformInterface + 4) = 0xbf000000;
      pCVar16->m_progCollection = (ProgramCollection<vk::ProgramBinary> *)CONCAT44(fVar24,fVar23);
      *(float *)&(pCVar16->m_device).
                 super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                 m_data.ptr = fVar22;
      *(ChannelOrder *)
       ((long)&(pCVar16->m_device).
               super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
               ptr + 4) = local_148.order;
      pTVar7[3].m_context =
           (Context *)
           &(pCVar16->m_device).
            super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
            field_0x8;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  return pTVar7;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}